

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O1

void __thiscall embree::FastAllocator::reset(FastAllocator *this)

{
  ulong uVar1;
  Block *pBVar2;
  pointer ppTVar3;
  Block *block;
  __pointer_type pBVar4;
  long lVar5;
  Block **ppBVar6;
  Block **ppBVar7;
  ulong uVar8;
  pointer ppTVar9;
  __pointer_type local_20;
  
  internal_fix_used_blocks(this);
  LOCK();
  (this->bytesUsed).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->bytesFree).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->bytesWasted).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  while ((this->usedBlocks)._M_b._M_p != (__pointer_type)0x0) {
    pBVar4 = (this->usedBlocks)._M_b._M_p;
    uVar1 = (pBVar4->allocEnd).super___atomic_base<unsigned_long>._M_i;
    uVar8 = (pBVar4->cur).super___atomic_base<unsigned_long>._M_i;
    if (uVar8 < uVar1) {
      uVar8 = uVar1;
    }
    LOCK();
    (pBVar4->allocEnd).super___atomic_base<unsigned_long>._M_i = uVar8;
    UNLOCK();
    LOCK();
    (pBVar4->cur).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    pBVar2 = ((this->usedBlocks)._M_b._M_p)->next;
    ((this->usedBlocks)._M_b._M_p)->next = (this->freeBlocks)._M_b._M_p;
    LOCK();
    (this->freeBlocks)._M_b._M_p = (this->usedBlocks)._M_b._M_p;
    UNLOCK();
    LOCK();
    (this->usedBlocks)._M_b._M_p = pBVar2;
    UNLOCK();
  }
  pBVar4 = (this->freeBlocks)._M_b._M_p;
  local_20 = pBVar4;
  if (pBVar4 != (__pointer_type)0x0) {
    ppBVar6 = &local_20;
    do {
      ppBVar7 = &pBVar4->next;
      if (pBVar4->atype == SHARED) {
        *ppBVar6 = *ppBVar7;
        ppBVar7 = ppBVar6;
      }
      pBVar4 = pBVar4->next;
      ppBVar6 = ppBVar7;
    } while (pBVar4 != (Block *)0x0);
  }
  LOCK();
  (this->freeBlocks)._M_b._M_p = local_20;
  UNLOCK();
  lVar5 = 0x17;
  do {
    LOCK();
    *(undefined8 *)((long)this + lVar5 * 8 + -0x40) = 0;
    UNLOCK();
    LOCK();
    this->threadUsedBlocks[lVar5 + -0xf]._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x1f);
  ppTVar3 = (this->thread_local_allocators).
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar9 = (this->thread_local_allocators).
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar9 != ppTVar3;
      ppTVar9 = ppTVar9 + 1) {
    ThreadLocal2::unbind(*ppTVar9,this);
  }
  ppTVar9 = (this->thread_local_allocators).
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->thread_local_allocators).
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar9) {
    (this->thread_local_allocators).
    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar9;
  }
  return;
}

Assistant:

void reset ()
    {
      internal_fix_used_blocks();

      bytesUsed.store(0);
      bytesFree.store(0);
      bytesWasted.store(0);

      /* reset all used blocks and move them to begin of free block list */
      while (usedBlocks.load() != nullptr) {
        usedBlocks.load()->reset_block();
        Block* nextUsedBlock = usedBlocks.load()->next;
        usedBlocks.load()->next = freeBlocks.load();
        freeBlocks = usedBlocks.load();
        usedBlocks = nextUsedBlock;
      }

      /* remove all shared blocks as they are re-added during build */
      freeBlocks.store(Block::remove_shared_blocks(freeBlocks.load()));

      for (size_t i=0; i<MAX_THREAD_USED_BLOCK_SLOTS; i++)
      {
        threadUsedBlocks[i] = nullptr;
        threadBlocks[i] = nullptr;
      }
      
      /* unbind all thread local allocators */
      for (auto alloc : thread_local_allocators) alloc->unbind(this);
      thread_local_allocators.clear();
    }